

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldisc.c
# Opt level: O1

LdiscInputToken ldisc_get_input_token(Ldisc *ldisc)

{
  uint uVar1;
  size_t sVar2;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar3;
  bufchain *ch;
  ulong uVar4;
  LdiscInputToken LVar5;
  char c;
  char data [8];
  byte local_21;
  byte local_20;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  uint local_1c;
  
  ch = &ldisc->input_queue;
  sVar2 = bufchain_size(ch);
  if (sVar2 == 0) {
    __assert_fail("bufchain_size(&ldisc->input_queue) > 0 && \"You\'re not supposed to call this unless there is buffered input!\""
                  ,"/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ldisc.c",0x120
                  ,"LdiscInputToken ldisc_get_input_token(Ldisc *)");
  }
  bufchain_fetch_consume(ch,&local_21,1);
  uVar3 = extraout_EDX;
  if (local_21 == 0xff) {
    uVar4 = 1;
    bufchain_fetch_consume(ch,&local_20,1);
    if (local_20 != 0xff) {
      bufchain_fetch_consume(ch,&local_1f,7);
      uVar1 = (uint)local_20 << 0x18 | (uint)local_1f << 0x10 | (uint)local_1e << 8;
      uVar3 = local_1c >> 0x18 | (local_1c & 0xff0000) >> 8 | (local_1c & 0xff00) << 8 |
              local_1c << 0x18;
      local_21 = local_1d;
      goto LAB_0011367f;
    }
    local_21 = 0xff;
    uVar3 = extraout_EDX_00;
  }
  uVar4 = 0;
  uVar1 = 0;
LAB_0011367f:
  LVar5._0_8_ = (ulong)(uVar1 | local_21) << 0x20 | uVar4;
  LVar5.field_1.field_1.arg = uVar3;
  return LVar5;
}

Assistant:

LdiscInputToken ldisc_get_input_token(Ldisc *ldisc)
{
    assert(bufchain_size(&ldisc->input_queue) > 0 &&
           "You're not supposed to call this unless there is buffered input!");

    LdiscInputToken tok;

    char c;
    bufchain_fetch_consume(&ldisc->input_queue, &c, 1);
    if (c != '\xFF') {
        /* A literal non-FF byte */
        tok.is_special = false;
        tok.chr = c;
        return tok;
    } else {
        char data[8];

        /* See if the byte after the FF is also FF, indicating a literal FF */
        bufchain_fetch_consume(&ldisc->input_queue, data, 1);
        if (data[0] == '\xFF') {
            tok.is_special = false;
            tok.chr = '\xFF';
            return tok;
        }

        /* If not, get the rest of an 8-byte chunk and decode a special */
        bufchain_fetch_consume(&ldisc->input_queue, data+1, 7);
        tok.is_special = true;
        tok.code = GET_32BIT_MSB_FIRST(data);
        tok.arg = toint(GET_32BIT_MSB_FIRST(data+4));
        return tok;
    }
}